

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerMemOp(Lowerer *this,Instr *instr)

{
  undefined2 uVar1;
  Func *func;
  code *pcVar2;
  bool bVar3;
  BailOutKind BVar4;
  undefined4 *puVar5;
  RegOpnd *helperRet;
  LabelInstr *target;
  IntConstOpnd *compareSrc2;
  Instr *pIVar6;
  uint lineNumber;
  Lowerer *this_00;
  Instr *pIVar7;
  BailOutKind local_34;
  
  uVar1 = instr->m_opcode;
  if (1 < (ushort)(uVar1 - 0x203)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x25e7,
                       "(instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy)"
                       ,
                       "instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy"
                      );
    if (!bVar3) goto LAB_005b403d;
    *puVar5 = 0;
  }
  pIVar7 = instr->m_prev;
  helperRet = IR::RegOpnd::New(TyInt8,instr->m_func);
  if ((instr->field_0x38 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x25ec,"(instr->HasBailOutInfo())","Expected bailOut on MemOp instruction");
    if (!bVar3) goto LAB_005b403d;
    *puVar5 = 0;
  }
  if ((instr->field_0x38 & 0x10) != 0) {
    local_34 = IR::Instr::GetBailOutKind(instr);
    if ((local_34 >> 0x12 & 1) == 0) {
      if ((local_34 >> 0xe & 1) != 0) {
        LowerBailOnCreatedMissingValue(this,instr,false);
        local_34 = local_34 & ~(BailOutOnInvalidatedArrayHeadSegment|BailOutOnMissingValue);
        if (local_34 != BailOutInvalid) {
          BVar4 = IR::Instr::GetBailOutKind(instr);
          if (BVar4 != local_34) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar5 = 1;
            lineNumber = 0x25fb;
            goto LAB_005b3dff;
          }
        }
      }
    }
    else {
      if ((local_34 >> 0xe & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x25f2,"(!(bailOutKind & IR::BailOutOnMissingValue))",
                           "!(bailOutKind & IR::BailOutOnMissingValue)");
        if (!bVar3) goto LAB_005b403d;
        *puVar5 = 0;
      }
      LowerBailOnInvalidatedArrayHeadSegment(this,instr,false);
      local_34 = local_34 & ~BailOutOnInvalidatedArrayHeadSegment;
      if (local_34 != BailOutInvalid) {
        BVar4 = IR::Instr::GetBailOutKind(instr);
        if (BVar4 != local_34) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          lineNumber = 0x25f5;
LAB_005b3dff:
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,lineNumber,"(!bailOutKind || instr->GetBailOutKind() == bailOutKind)",
                             "!bailOutKind || instr->GetBailOutKind() == bailOutKind");
          if (!bVar3) goto LAB_005b403d;
          *puVar5 = 0;
        }
      }
    }
    if ((local_34 >> 0x13 & 1) != 0) {
      LowerBailOnInvalidatedArrayLength(this,instr,false);
      local_34 = local_34 & ~(BailOutOnInvalidatedArrayLength|BailOutOnInvalidatedArrayHeadSegment);
      if (local_34 != BailOutInvalid) {
        BVar4 = IR::Instr::GetBailOutKind(instr);
        if (BVar4 != local_34) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2601,"(!bailOutKind || instr->GetBailOutKind() == bailOutKind)",
                             "!bailOutKind || instr->GetBailOutKind() == bailOutKind");
          if (!bVar3) goto LAB_005b403d;
          *puVar5 = 0;
        }
      }
    }
    if ((local_34 & BailOutOnMemOpError) == BailOutInvalid) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2604,"(bailOutKind & IR::BailOutOnMemOpError)",
                         "Expected BailOutOnMemOpError on MemOp instruction");
      if (!bVar3) goto LAB_005b403d;
      *puVar5 = 0;
      if ((local_34 & BailOutOnMemOpError) != BailOutInvalid) goto LAB_005b3f14;
    }
    else {
LAB_005b3f14:
      target = IR::Instr::GetOrCreateContinueLabel(instr,false);
      func = instr->m_func;
      LowerOneBailOutKind(this,instr,BailOutOnMemOpError,false,false);
      pIVar6 = instr->m_next;
      this_00 = (Lowerer *)0x0;
      compareSrc2 = IR::IntConstOpnd::New(0,TyInt8,func,false);
      InsertCompareBranch(this_00,&helperRet->super_Opnd,&compareSrc2->super_Opnd,BrNeq_A,false,
                          target,pIVar6,false);
      if (local_34 != BailOutOnMemOpError) {
        BVar4 = IR::Instr::GetBailOutKind(instr);
        if ((BVar4 ^ local_34) != BailOutOnMemOpError) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x261a,"(!bailOutKind || instr->GetBailOutKind() == bailOutKind)",
                             "!bailOutKind || instr->GetBailOutKind() == bailOutKind");
          if (!bVar3) {
LAB_005b403d:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
      }
    }
    IR::Instr::ClearBailOutInfo(instr);
  }
  if (instr->m_opcode == Memcopy) {
    LowerMemcopy(this,instr,helperRet);
  }
  else if (instr->m_opcode == Memset) {
    pIVar6 = LowerMemset(this,instr,helperRet);
    goto LAB_005b4024;
  }
  pIVar6 = (Instr *)0x0;
LAB_005b4024:
  if (pIVar6 != (Instr *)0x0) {
    pIVar7 = pIVar6;
  }
  return pIVar7;
}

Assistant:

IR::Instr *
Lowerer::LowerMemOp(IR::Instr * instr)
{
    Assert(instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy);
    IR::Instr *instrPrev = instr->m_prev;

    IR::RegOpnd* helperRet = IR::RegOpnd::New(TyInt8, instr->m_func);
    const bool isHelper = false;
    AssertMsg(instr->HasBailOutInfo(), "Expected bailOut on MemOp instruction");
    if (instr->HasBailOutInfo())
    {
        IR::BailOutKind bailOutKind = instr->GetBailOutKind();
        if (bailOutKind & IR::BailOutOnInvalidatedArrayHeadSegment)
        {
            Assert(!(bailOutKind & IR::BailOutOnMissingValue));
            LowerBailOnInvalidatedArrayHeadSegment(instr, isHelper);
            bailOutKind ^= IR::BailOutOnInvalidatedArrayHeadSegment;
            Assert(!bailOutKind || instr->GetBailOutKind() == bailOutKind);
        }
        else if (bailOutKind & IR::BailOutOnMissingValue)
        {
            LowerBailOnCreatedMissingValue(instr, isHelper);
            bailOutKind ^= IR::BailOutOnMissingValue;
            Assert(!bailOutKind || instr->GetBailOutKind() == bailOutKind);
        }
        if (bailOutKind & IR::BailOutOnInvalidatedArrayLength)
        {
            LowerBailOnInvalidatedArrayLength(instr, isHelper);
            bailOutKind ^= IR::BailOutOnInvalidatedArrayLength;
            Assert(!bailOutKind || instr->GetBailOutKind() == bailOutKind);
        }

        AssertMsg(bailOutKind & IR::BailOutOnMemOpError, "Expected BailOutOnMemOpError on MemOp instruction");
        if (bailOutKind & IR::BailOutOnMemOpError)
        {
            // Insert or get continue label
            IR::LabelInstr *const skipBailOutLabel = instr->GetOrCreateContinueLabel(isHelper);
            Func *const func = instr->m_func;
            LowerOneBailOutKind(instr, IR::BailOutOnMemOpError, isHelper);
            IR::Instr *const insertBeforeInstr = instr->m_next;

            //     test helperRet, helperRet
            //     jz $skipBailOut
            InsertCompareBranch(
                helperRet,
                IR::IntConstOpnd::New(0, TyInt8, func),
                Js::OpCode::BrNeq_A,
                skipBailOutLabel,
                insertBeforeInstr);

            //     (Bail out with IR::BailOutOnMemOpError)
            //     $skipBailOut:

            bailOutKind ^= IR::BailOutOnMemOpError;
            Assert(!bailOutKind || instr->GetBailOutKind() == bailOutKind);
        }

        instr->ClearBailOutInfo();
    }

    IR::Instr* newInstrPrev = nullptr;
    if (instr->m_opcode == Js::OpCode::Memset)
    {
        newInstrPrev = LowerMemset(instr, helperRet);
    }
    else if (instr->m_opcode == Js::OpCode::Memcopy)
    {
        newInstrPrev = LowerMemcopy(instr, helperRet);
    }

    if (newInstrPrev != nullptr)
    {
        instrPrev = newInstrPrev;
    }
    return instrPrev;
}